

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1e8ba::CpuTest_jmp_indirect_fetches_address_from_same_page_Test::
~CpuTest_jmp_indirect_fetches_address_from_same_page_Test
          (CpuTest_jmp_indirect_fetches_address_from_same_page_Test *this)

{
  CpuTest_jmp_indirect_fetches_address_from_same_page_Test *this_local;
  
  n_e_s::core::test::CpuTest::~CpuTest(&this->super_CpuTest);
  return;
}

Assistant:

TEST_F(CpuTest, jmp_indirect_fetches_address_from_same_page) {
    registers.pc = 0x1000;
    stage_instruction(JMP_IND);
    expected.pc = 0x6789;

    EXPECT_CALL(mmu, read_byte(registers.pc + 1u)).WillOnce(Return(0xFF));
    EXPECT_CALL(mmu, read_byte(registers.pc + 2u)).WillOnce(Return(0x12));
    // Address is fetched from 0x12FF and 0x1200 instead of 0x12FF and 0x1300
    EXPECT_CALL(mmu, read_byte(0x12FF)).WillOnce(Return(0x89));
    EXPECT_CALL(mmu, read_byte(0x1200)).WillOnce(Return(0x67));

    step_execution(5);

    EXPECT_EQ(expected, registers);
}